

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_mul_txx9(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  TCGContext_conflict6 *s;
  TCGTemp *pTVar1;
  TCGTemp *a1;
  TCGTemp *pTVar2;
  TCGTemp *pTVar3;
  TCGv_i64 pTVar4;
  long lVar5;
  uintptr_t o_4;
  TCGOpcode opc_00;
  uintptr_t o_3;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i32 ret_01;
  TCGv_i64 arg;
  uintptr_t o_2;
  TCGv_i32 ret_02;
  
  s = ctx->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar1 - (long)s);
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  if (rs == 0) {
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar1,0);
  }
  else if (s->cpu_gpr[rs] != ret) {
    tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar1,(TCGArg)(s->cpu_gpr[rs] + (long)s));
  }
  ret_00 = (TCGv_i64)((long)a1 - (long)s);
  if (rt == 0) {
    opc_00 = INDEX_op_movi_i64;
    pTVar4 = (TCGv_i64)0x0;
LAB_009b7e1f:
    tcg_gen_op2_mips64el(s,opc_00,(TCGArg)a1,(TCGArg)pTVar4);
  }
  else if (s->cpu_gpr[rt] != ret_00) {
    pTVar4 = s->cpu_gpr[rt] + (long)s;
    opc_00 = INDEX_op_mov_i64;
    goto LAB_009b7e1f;
  }
  lVar5 = 0;
  if ((int)opc < 0x70000001) {
    if (opc != 0x18) {
      if (opc != 0x19) {
        if (opc == 0x70000000) goto LAB_009b80bd;
        goto switchD_009b7e6b_caseD_7000001a;
      }
      lVar5 = 0;
      goto LAB_009b8000;
    }
    lVar5 = 0;
LAB_009b7e78:
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    ret_01 = (TCGv_i32)((long)pTVar1 - (long)s);
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    ret_02 = (TCGv_i32)((long)pTVar1 - (long)s);
    tcg_gen_extrl_i64_i32_mips64el(s,ret_01,ret);
    tcg_gen_extrl_i64_i32_mips64el(s,ret_02,ret_00);
    tcg_gen_muls2_i32_mips64el(s,ret_01,ret_02,ret_01,ret_02);
LAB_009b8054:
    if (rd != 0) {
      tcg_gen_ext_i32_i64_mips64el(s,s->cpu_gpr[(uint)rd],ret_01);
    }
    tcg_gen_ext_i32_i64_mips64el(s,s->cpu_LO[lVar5],ret_01);
    tcg_gen_ext_i32_i64_mips64el(s,s->cpu_HI[lVar5],ret_02);
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret_01 + (long)s));
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret_02 + (long)s));
    goto LAB_009b81f4;
  }
  switch(opc) {
  case 0x70000018:
    lVar5 = 1;
    goto LAB_009b7e78;
  case 0x70000019:
    lVar5 = 1;
LAB_009b8000:
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    ret_01 = (TCGv_i32)((long)pTVar1 - (long)s);
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    ret_02 = (TCGv_i32)((long)pTVar1 - (long)s);
    tcg_gen_extrl_i64_i32_mips64el(s,ret_01,ret);
    tcg_gen_extrl_i64_i32_mips64el(s,ret_02,ret_00);
    tcg_gen_mulu2_i32_mips64el(s,ret_01,ret_02,ret_01,ret_02);
    goto LAB_009b8054;
  case 0x70000020:
    lVar5 = 1;
LAB_009b80bd:
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    if (pTVar2 != pTVar1) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar2,(TCGArg)pTVar1);
    }
    arg = (TCGv_i64)((long)pTVar2 - (long)s);
    pTVar4 = (TCGv_i64)((long)pTVar3 - (long)s);
    if (pTVar3 != a1) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar3,(TCGArg)a1);
    }
    tcg_gen_op3_mips64el(s,INDEX_op_mul_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)pTVar3);
    tcg_gen_deposit_i64_mips64el(s,pTVar4,s->cpu_LO[lVar5],s->cpu_HI[lVar5],0x20,0x20);
    tcg_gen_op3_mips64el(s,INDEX_op_add_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)pTVar3);
    goto LAB_009b818f;
  case 0x70000021:
    lVar5 = 1;
LAB_009b7efd:
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    tcg_gen_ext32u_i64_mips64el(s,ret,ret);
    tcg_gen_ext32u_i64_mips64el(s,ret_00,ret_00);
    if (pTVar2 != pTVar1) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar2,(TCGArg)pTVar1);
    }
    arg = (TCGv_i64)((long)pTVar2 - (long)s);
    pTVar4 = (TCGv_i64)((long)pTVar3 - (long)s);
    if (pTVar3 != a1) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar3,(TCGArg)a1);
    }
    tcg_gen_op3_mips64el(s,INDEX_op_mul_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)pTVar3);
    tcg_gen_deposit_i64_mips64el(s,pTVar4,s->cpu_LO[lVar5],s->cpu_HI[lVar5],0x20,0x20);
    tcg_gen_op3_mips64el(s,INDEX_op_add_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)pTVar3);
LAB_009b818f:
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar4 + (long)s));
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_LO[lVar5],arg);
    tcg_gen_sari_i64_mips64el(s,s->cpu_HI[lVar5],arg,0x20);
    if (rd != 0) {
      tcg_gen_ext32s_i64_mips64el(s,s->cpu_gpr[(uint)rd],arg);
    }
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg + (long)s));
    break;
  default:
    if (opc == 0x70000001) goto LAB_009b7efd;
  case 0x7000001a:
  case 0x7000001b:
  case 0x7000001c:
  case 0x7000001d:
  case 0x7000001e:
  case 0x7000001f:
switchD_009b7e6b_caseD_7000001a:
    generate_exception_err(ctx,0x14,0);
  }
LAB_009b81f4:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret_00 + (long)s));
  return;
}

Assistant:

static void gen_mul_txx9(DisasContext *ctx, uint32_t opc,
                         int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    int acc = 0;

    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);

    switch (opc) {
    case MMI_OPC_MULT1:
        acc = 1;
        /* Fall through */
    case OPC_MULT:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_muls2_i32(tcg_ctx, t2, t3, t2, t3);
            if (rd) {
                tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            }
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case MMI_OPC_MULTU1:
        acc = 1;
        /* Fall through */
    case OPC_MULTU:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mulu2_i32(tcg_ctx, t2, t3, t2, t3);
            if (rd) {
                tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            }
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case MMI_OPC_MADD1:
        acc = 1;
        /* Fall through */
    case MMI_OPC_MADD:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_ext_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_add_i64(tcg_ctx, t2, t2, t3);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            if (rd) {
                gen_move_low32(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            }
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    case MMI_OPC_MADDU1:
        acc = 1;
        /* Fall through */
    case MMI_OPC_MADDU:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_extu_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_extu_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_add_i64(tcg_ctx, t2, t2, t3);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            if (rd) {
                gen_move_low32(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            }
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    default:
        MIPS_INVAL("mul/madd TXx9");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

 out:
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}